

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedstack.cpp
# Opt level: O2

ElementType Pop(LinkedStack *LS)

{
  ElementType EVar1;
  ostream *poVar2;
  
  if (LS->stack->size != 0) {
    EVar1 = GetData(LS->stack);
    DeleteAt(LS->stack);
    return EVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Pop: underflowed!");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

ElementType Pop(LinkedStack *LS) {  //出栈
    ElementType tmpData;
    if(!(LS->stack)->size) { //若栈为空
        cout << "Pop: underflowed!" << endl;
        exit(1);
    }
    tmpData = GetData(LS->stack);
    DeleteAt(LS->stack);
    return tmpData;
}